

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O3

void __thiscall
Secp256k1_TweakPrivkeySecp256k1EcErrorTest_Test::TestBody
          (Secp256k1_TweakPrivkeySecp256k1EcErrorTest_Test *this)

{
  pointer paVar1;
  bool bVar2;
  void *pvVar3;
  pointer paVar4;
  ByteData actual;
  Secp256k1 secp;
  TweakPrivkeyTestVector test_vector;
  AssertHelper AStack_c8;
  ByteData local_c0;
  undefined1 local_a8 [32];
  void *local_88;
  char *local_70;
  long local_68;
  char local_60 [16];
  char *local_50;
  char local_40 [16];
  
  pvVar3 = (void *)wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1((Secp256k1 *)local_a8,pvVar3);
  paVar1 = tweak_privkey_error_vectors.
           super__Vector_base<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (tweak_privkey_error_vectors.
      super__Vector_base<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>._M_impl.
      super__Vector_impl_data._M_start !=
      tweak_privkey_error_vectors.
      super__Vector_base<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar4 = tweak_privkey_error_vectors.
             super__Vector_base<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      anon_struct_112_4_5aca4469::TweakPrivkeyTestVector
                ((anon_struct_112_4_5aca4469 *)(local_a8 + 8),paVar4);
      if (local_68 == 0) {
        bVar2 = testing::internal::AlwaysTrue();
        if ((bVar2) &&
           (cfd::core::Secp256k1::AddTweakPrivkeySecp256k1Ec(&local_c0,(ByteData *)local_a8),
           (long *)local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start != (long *)0x0)) {
          operator_delete(local_c0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        testing::Message::Message((Message *)&local_c0);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_secp256k1.cpp"
                   ,0x171,
                   "Expected: ByteData actual = secp.AddTweakPrivkeySecp256k1Ec(test_vector.privkey, test_vector.tweak) throws an exception of type CfdException.\n  Actual: it throws nothing."
                  );
        testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
        if ((((long *)local_c0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start != (long *)0x0) &&
            (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
           ((long *)local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start != (long *)0x0)) {
          (**(code **)(*(long *)local_c0.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + 8))();
        }
        if (local_68 == 0) {
          bVar2 = testing::internal::AlwaysTrue();
          if ((bVar2) &&
             (cfd::core::Secp256k1::MulTweakPrivkeySecp256k1Ec(&local_c0,(ByteData *)local_a8),
             (long *)local_c0.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start != (long *)0x0)) {
            operator_delete(local_c0.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          testing::Message::Message((Message *)&local_c0);
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_c8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_secp256k1.cpp"
                     ,0x177,
                     "Expected: ByteData actual = secp.MulTweakPrivkeySecp256k1Ec(test_vector.privkey, test_vector.tweak) throws an exception of type CfdException.\n  Actual: it throws nothing."
                    );
          testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
          testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
          if ((((long *)local_c0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start != (long *)0x0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             ((long *)local_c0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start != (long *)0x0)) {
            (**(code **)(*(long *)local_c0.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      if (local_88 != (void *)0x0) {
        operator_delete(local_88);
      }
      if ((pointer)local_a8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_a8._8_8_);
      }
      paVar4 = paVar4 + 1;
    } while (paVar4 != paVar1);
  }
  return;
}

Assistant:

TEST(Secp256k1, TweakPrivkeySecp256k1EcErrorTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (TweakPrivkeyTestVector test_vector : tweak_privkey_error_vectors) {
    if (test_vector.expect_add.empty()) {
      EXPECT_THROW(
        ByteData actual = secp.AddTweakPrivkeySecp256k1Ec(test_vector.privkey,
          test_vector.tweak),
        CfdException);
    }
    if (test_vector.expect_add.empty()) {
      EXPECT_THROW(
        ByteData actual = secp.MulTweakPrivkeySecp256k1Ec(test_vector.privkey,
          test_vector.tweak),
        CfdException);
    }
  }
}